

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O0

bool __thiscall
boost::detail::function::
basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
::assign_to<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
          (void *param_1,token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *param_2,
          undefined8 param_3)

{
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *ptVar1;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> local_78;
  undefined8 local_58;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *local_50;
  void *local_48;
  bool local_39;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *local_38;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *local_30;
  undefined8 local_28;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *local_20;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *local_18;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> **local_10;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> **local_8;
  
  local_10 = &local_38;
  local_8 = &local_38;
  local_28 = 0;
  local_58 = param_3;
  local_50 = param_2;
  local_48 = param_1;
  local_30 = param_2;
  local_20 = param_2;
  local_18 = param_2;
  local_38 = param_2;
  local_39 = has_empty_target(param_2);
  if (!local_39) {
    ptVar1 = &local_78;
    algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::token_finderF
              (param_2,ptVar1);
    assign_functor<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
              ((basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_1,ptVar1,local_58);
    algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::~token_finderF
              ((token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)0x1960f8);
  }
  local_39 = !local_39;
  return local_39;
}

Assistant:

bool 
        assign_to(FunctionObj f, function_buffer& functor, function_obj_tag) const
        {
          if (!boost::detail::function::has_empty_target(boost::addressof(f))) {
            assign_functor(f, functor, 
                           mpl::bool_<(function_allows_small_object_optimization<FunctionObj>::value)>());
            return true;
          } else {
            return false;
          }
        }